

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

void __thiscall
edition_unittest::TestNestedMessageHasBits_NestedMessage::Clear
          (TestNestedMessageHasBits_NestedMessage *this)

{
  uint32_t cached_has_bits;
  TestNestedMessageHasBits_NestedMessage *this_local;
  
  google::protobuf::RepeatedField<int>::Clear(&(this->field_0)._impl_.nestedmessage_repeated_int32_)
  ;
  google::protobuf::RepeatedPtrField<edition_unittest::ForeignMessage>::Clear
            (&(this->field_0)._impl_.nestedmessage_repeated_foreignmessage_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestNestedMessageHasBits_NestedMessage::Clear() {
// @@protoc_insertion_point(message_clear_start:edition_unittest.TestNestedMessageHasBits.NestedMessage)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.nestedmessage_repeated_int32_.Clear();
  _impl_.nestedmessage_repeated_foreignmessage_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}